

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

UniValue *
JSONRPCTransactionError(UniValue *__return_storage_ptr__,TransactionError terr,string *err_string)

{
  uint code;
  long in_FS_OFFSET;
  bilingual_str local_60;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  code = 0xffffffe6;
  if (terr != MEMPOOL_REJECTED) {
    code = (uint)(terr != ALREADY_IN_UTXO_SET) * 2 | 0xffffffe5;
  }
  if (err_string->_M_string_length == 0) {
    common::TransactionErrorString(&local_60,terr);
    JSONRPCError(__return_storage_ptr__,code,&local_60.original);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.translated._M_dataplus._M_p != &local_60.translated.field_2) {
      operator_delete(local_60.translated._M_dataplus._M_p,
                      local_60.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.original._M_dataplus._M_p != &local_60.original.field_2) {
      operator_delete(local_60.original._M_dataplus._M_p,
                      local_60.original.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_00373169;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_00373169:
      __stack_chk_fail();
    }
    JSONRPCError(__return_storage_ptr__,code,err_string);
  }
  return __return_storage_ptr__;
}

Assistant:

UniValue JSONRPCTransactionError(TransactionError terr, const std::string& err_string)
{
    if (err_string.length() > 0) {
        return JSONRPCError(RPCErrorFromTransactionError(terr), err_string);
    } else {
        return JSONRPCError(RPCErrorFromTransactionError(terr), TransactionErrorString(terr).original);
    }
}